

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Flip(FlipForm2 Flip)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  reference pvVar4;
  reference pvVar5;
  code *in_RDI;
  bool bVar6;
  bool bVar7;
  uint32_t yCorrection;
  uint32_t xCorrection;
  bool verticalFlip;
  bool horizontalFlip;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  uint8_t intensityFill;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_fffffffffffffe2c;
  uint in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined2 uVar8;
  uint32_t in_stack_fffffffffffffe38;
  uint32_t in_stack_fffffffffffffe3c;
  uint8_t uVar9;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  size_type __n;
  Image *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe70;
  uint8_t value;
  ImageTemplate<unsigned_char> *pIVar10;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Image *in_stack_fffffffffffffed0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed8;
  size_type sVar11;
  ImageTemplate<unsigned_char> local_58;
  uint8_t local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  code *local_10;
  byte local_1;
  
  value = (uint8_t)((ulong)in_stack_fffffffffffffe70 >> 0x38);
  uVar8 = (undefined2)((uint)in_stack_fffffffffffffe34 >> 0x10);
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffe2c);
  local_29 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
             (uint8_t)((ushort)uVar8 >> 8),(uint8_t)uVar8);
  uVar9 = (uint8_t)(in_stack_fffffffffffffe3c >> 0x18);
  Test_Helper::uniformImages(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d4215);
  uVar1 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  bVar6 = uVar1 == 0;
  uVar1 = Test_Helper::randomValue<unsigned_int>
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  bVar7 = uVar1 == 0;
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&local_58,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&local_58,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
  if (bVar7) {
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&local_58,0);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
    if (1 < uVar2) {
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)&local_58,0);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,0);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,0);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
      Image_Function::Fill
                (in_stack_fffffffffffffe50,(uint32_t)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe48,
                 (uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe40,uVar9);
    }
  }
  else if (bVar6) {
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&local_58,0);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
    if (1 < uVar2) {
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)&local_58,0);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,0);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,0);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
      Image_Function::Fill
                (in_stack_fffffffffffffe50,(uint32_t)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe48,
                 (uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffe40,uVar9);
    }
  }
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&local_58,0);
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&local_58,1);
  (*local_10)(pvVar4,pvVar5,bVar6,bVar7);
  if (bVar7) {
    pIVar10 = &local_58;
    sVar11 = 1;
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  *)pIVar10,1);
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)pIVar10,sVar11);
    PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&local_58,1);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
    bVar6 = Unit_Test::verifyImage
                      ((Image *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffe80,
                       (uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffe78,value);
    if (!bVar6) {
      local_1 = 0;
      goto LAB_001d49bf;
    }
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&local_58,0);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
    if (1 < uVar2) {
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)&local_58,1);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,1);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,1);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,1);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
      bVar6 = Unit_Test::verifyImage
                        ((Image *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                         (uint32_t)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffe80,
                         (uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffe78,value);
      if (!bVar6) {
        local_1 = 0;
        goto LAB_001d49bf;
      }
    }
  }
  else {
    pIVar10 = &local_58;
    sVar11 = 1;
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)pIVar10,1);
    pvVar5 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)pIVar10,sVar11);
    uVar9 = (uint8_t)((ulong)pIVar10 >> 0x38);
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar5);
    pvVar5 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&local_58,1);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
    bVar7 = Unit_Test::verifyImage
                      ((Image *)CONCAT44(uVar2,in_stack_fffffffffffffe88),
                       (uint32_t)((ulong)pvVar4 >> 0x20),(uint32_t)pvVar4,(uint32_t)(sVar11 >> 0x20)
                       ,(uint32_t)sVar11,uVar9);
    if (!bVar7) {
      local_1 = 0;
      goto LAB_001d49bf;
    }
    pvVar5 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)&local_58,0);
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar5);
    if (1 < uVar3) {
      in_stack_fffffffffffffe40 = &local_58;
      __n = 1;
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe40,1);
      pvVar5 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)in_stack_fffffffffffffe40,__n);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar5);
      pvVar5 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,1);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar5);
      pvVar5 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)&local_58,1);
      PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar5);
      if (!bVar6) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_28,0);
      }
      bVar6 = Unit_Test::verifyImage
                        ((Image *)CONCAT44(uVar2,in_stack_fffffffffffffe88),
                         (uint32_t)((ulong)pvVar4 >> 0x20),(uint32_t)pvVar4,
                         (uint32_t)(sVar11 >> 0x20),(uint32_t)sVar11,uVar9);
      if (!bVar6) {
        local_1 = 0;
        goto LAB_001d49bf;
      }
    }
  }
  local_1 = 1;
LAB_001d49bf:
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_fffffffffffffe40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
  return (bool)(local_1 & 1);
}

Assistant:

bool form2_Flip(FlipForm2 Flip)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const uint8_t intensityFill = intensityValue();
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const bool horizontalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const bool verticalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const uint32_t xCorrection = input[0].width() % 2;
        const uint32_t yCorrection = input[0].height() % 2;

        if (verticalFlip)
        {
            if (input[0].height() > 1)
                Image_Function::Fill(input[0], 0, 0, input[0].width(), input[0].height() / 2, intensityFill);
        }
        else if (horizontalFlip)
        {
            if (input[0].width() > 1)
                Image_Function::Fill(input[0], 0, 0, input[0].width() / 2, input[0].height(), intensityFill);
        }

        Flip( input[0], input[1], horizontalFlip, verticalFlip );

        if (verticalFlip) {
            if( !verifyImage( input[1], 0, 0, input[1].width(), input[1].height() / 2 + yCorrection, intensity[0] ) )
                return false;
            if((input[0].height() > 1) && !verifyImage( input[1], 0, input[1].height() / 2 + yCorrection, input[1].width(), input[1].height() / 2, intensityFill ) )
                return false;
        }
        else {
            if( !verifyImage( input[1], 0, 0, input[1].width() / 2 + xCorrection, input[1].height(), intensity[0] ) )
                return false;
            if((input[0].width() > 1) && !verifyImage( input[1], input[1].width() / 2 + xCorrection, 0, input[1].width() / 2, input[1].height(),
                                                       horizontalFlip ? intensityFill : intensity[0] ) )
                return false;
        }

        return true;
    }